

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statemachine.cc
# Opt level: O0

statemachine_ctx * ctemplate_htmlparser::statemachine_new(statemachine_definition *def,void *user)

{
  statemachine_ctx *ctx;
  void *user_local;
  statemachine_definition *def_local;
  
  if (def != (statemachine_definition *)0x0) {
    def_local = (statemachine_definition *)malloc(0x188);
    if ((statemachine_ctx *)def_local == (statemachine_ctx *)0x0) {
      def_local = (statemachine_definition *)0x0;
    }
    else {
      statemachine_reset((statemachine_ctx *)def_local);
      ((statemachine_ctx *)def_local)->definition = def;
      ((statemachine_ctx *)def_local)->user = user;
    }
    return (statemachine_ctx *)def_local;
  }
  __assert_fail("def != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/htmlparser/statemachine.cc"
                ,0xf3,
                "statemachine_ctx *ctemplate_htmlparser::statemachine_new(statemachine_definition *, void *)"
               );
}

Assistant:

statemachine_ctx *statemachine_new(statemachine_definition *def,
                                   void *user)
{
    statemachine_ctx *ctx;
    assert(def != NULL);
    ctx = CAST(statemachine_ctx *, malloc(sizeof(statemachine_ctx)));
    if (ctx == NULL)
      return NULL;

    statemachine_reset(ctx);

    ctx->definition = def;
    ctx->user = user;

    return ctx;
}